

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall QObjectPrivate::addConnection(QObjectPrivate *this,int signal,Connection *c)

{
  Type TVar1;
  ConnectionData *this_00;
  __pointer_type pSVar2;
  QObjectPrivate *this_01;
  AtomicType AVar3;
  Connection *pCVar4;
  __pointer_type pSVar5;
  
  ensureConnectionData(this);
  this_00 = (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
            _M_b._M_p;
  ConnectionData::resizeSignalVector(this_00,(long)(signal + 1));
  pSVar2 = (this_00->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value.
           _M_b._M_p;
  pSVar5 = pSVar2 + (long)signal + 1;
  if (pSVar2[(long)signal + 2].allocated != 0) {
    pSVar5 = (__pointer_type)pSVar2[(long)signal + 2].allocated;
  }
  pSVar5[1].super_ConnectionOrSignalVector.field_0.next = c;
  LOCK();
  TVar1.super___atomic_base<unsigned_int>._M_i =
       (this_00->currentConnectionId).super_QBasicAtomicInteger<unsigned_int>._q_value.
       super___atomic_base<unsigned_int>;
  (this_00->currentConnectionId).super_QBasicAtomicInteger<unsigned_int>._q_value.
  super___atomic_base<unsigned_int> =
       (__atomic_base<unsigned_int>)
       ((__int_type_conflict3)
        (this_00->currentConnectionId).super_QBasicAtomicInteger<unsigned_int>._q_value.
        super___atomic_base<unsigned_int> + 1);
  UNLOCK();
  c->id = (int)TVar1.super___atomic_base<unsigned_int>._M_i + 1;
  c->prevConnectionList = (Connection *)pSVar2[(long)signal + 2].allocated;
  pSVar2[(long)signal + 2].allocated = (quintptr)c;
  this_01 = (QObjectPrivate *)
            (((c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p)->d_ptr).d;
  ensureConnectionData(this_01);
  AVar3._M_b._M_p =
       (this_01->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
       _M_b;
  c->prev = (Connection **)((long)AVar3._M_b._M_p + 0x10);
  (c->super_ConnectionOrSignalVector).field_0 =
       *(anon_union_8_2_521c276c_for_ConnectionOrSignalVector_0 *)((long)AVar3._M_b._M_p + 0x10);
  *(Connection **)((long)AVar3._M_b._M_p + 0x10) = c;
  pCVar4 = (c->super_ConnectionOrSignalVector).field_0.next;
  if (pCVar4 != (Connection *)0x0) {
    pCVar4->prev = (Connection **)c;
  }
  return;
}

Assistant:

inline void QObjectPrivate::addConnection(int signal, Connection *c)
{
    Q_ASSERT(c->sender == q_ptr);
    ensureConnectionData();
    ConnectionData *cd = connections.loadRelaxed();
    cd->resizeSignalVector(signal + 1);

    ConnectionList &connectionList = cd->connectionsForSignal(signal);
    if (connectionList.last.loadRelaxed()) {
        Q_ASSERT(connectionList.last.loadRelaxed()->receiver.loadRelaxed());
        connectionList.last.loadRelaxed()->nextConnectionList.storeRelaxed(c);
    } else {
        connectionList.first.storeRelaxed(c);
    }
    c->id = ++cd->currentConnectionId;
    c->prevConnectionList = connectionList.last.loadRelaxed();
    connectionList.last.storeRelaxed(c);

    QObjectPrivate *rd = QObjectPrivate::get(c->receiver.loadRelaxed());
    rd->ensureConnectionData();

    c->prev = &(rd->connections.loadRelaxed()->senders);
    c->next = *c->prev;
    *c->prev = c;
    if (c->next)
        c->next->prev = &c->next;
}